

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O1

string * hedg::Timing::now_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  time_t now;
  time_t local_18;
  
  local_18 = time((time_t *)0x0);
  __tp = gmtime(&local_18);
  strftime(buf,0x15,"%FT%TZ",__tp);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(buf);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string Timing::now() {
	std::time_t now = std::time(0);
	tm* gmtm = gmtime(&now);
	std::strftime(buf, time_size, "%FT%TZ", gmtm);
	return buf;
}